

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O2

int16_t spell_chance(wchar_t spell_index)

{
  short sVar1;
  loc grid;
  player *ppVar2;
  _Bool _Var3;
  int iVar4;
  class_spell_conflict *pcVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  ppVar2 = player;
  iVar7 = 100;
  if (((player->class->magic).total_spells != L'\0') &&
     (pcVar5 = spell_by_index(player,spell_index), pcVar5 != (class_spell_conflict *)0x0)) {
    uVar8 = (ulong)(ppVar2->state).stat_ind[pcVar5->realm->stat];
    iVar4 = pcVar5->smana - (int)ppVar2->csp;
    iVar7 = iVar4 * 5;
    if (iVar4 == 0 || pcVar5->smana < (int)ppVar2->csp) {
      iVar7 = 0;
    }
    iVar7 = iVar7 + ((((int)ppVar2->lev - pcVar5->slevel) * -3 + pcVar5->sfail) -
                    adj_mag_stat[uVar8]);
    iVar4 = adj_mag_fail[uVar8];
    _Var3 = flag_has_dbg((ppVar2->state).pflags,10,0x2d,"player->state.pflags","(PF_STRONG_MAGIC)");
    iVar6 = 5;
    if (_Var3) {
      iVar6 = iVar4;
    }
    if (uVar8 < 0x14) {
      iVar6 = iVar4;
    }
    _Var3 = flag_has_dbg((player->state).pflags,10,0x1f,"player->state.pflags","(PF_UNLIGHT)");
    iVar4 = iVar7;
    if (_Var3) {
      grid.x = (player->grid).x;
      grid.y = (player->grid).y;
      _Var3 = square_islit(cave,grid);
      iVar4 = iVar7 + 0x19;
      if (!_Var3) {
        iVar4 = iVar7;
      }
    }
    _Var3 = player_of_has(player,L'\x1c');
    iVar7 = iVar4 + 0x14;
    if (!_Var3) {
      iVar7 = iVar4;
    }
    if (iVar7 <= iVar6) {
      iVar7 = iVar6;
    }
    iVar4 = 0x32;
    if (iVar7 < 0x32) {
      iVar4 = iVar7;
    }
    sVar1 = player->timed[9];
    iVar7 = iVar4 + 0xf;
    if (sVar1 == 0) {
      iVar7 = iVar4;
    }
    if (0x32 < sVar1) {
      iVar7 = iVar4 + 0x19;
    }
    if (player->timed[0x19] != 0) {
      iVar7 = iVar7 / 2 + 0x32;
    }
  }
  return (int16_t)iVar7;
}

Assistant:

int16_t spell_chance(int spell_index)
{
	int chance = 100, minfail;

	const struct class_spell *spell;

	/* Paranoia -- must be literate */
	if (!player->class->magic.total_spells) return chance;

	/* Get the spell */
	spell = spell_by_index(player, spell_index);
	if (!spell) return chance;

	/* Extract the base spell failure rate */
	chance = spell->sfail;

	/* Reduce failure rate by "effective" level adjustment */
	chance -= 3 * (player->lev - spell->slevel);

	/* Reduce failure rate by casting stat level adjustment */
	chance -= fail_adjust(player, spell);

	/* Not enough mana to cast */
	if (spell->smana > player->csp)
		chance += 5 * (spell->smana - player->csp);

	/* Get the minimum failure rate for the casting stat level */
	minfail = min_fail(player, spell);

	/* Non-full spellcasters never get better than 5 percent */
	if (!player_has(player, PF_STRONG_MAGIC) && minfail < 5) {
		minfail = 5;
	}

	/* Necromancers are punished by being on lit squares */
	if (player_has(player, PF_UNLIGHT) && square_islit(cave, player->grid)) {
		chance += 25;
	}

	/* Fear makes spells harder (before minfail) */
	/* Note that spells that remove fear have a much lower fail rate than
	 * surrounding spells, to make sure this doesn't cause mega fail */
	if (player_of_has(player, OF_AFRAID)) chance += 20;

	/* Minimal and maximal failure rate */
	if (chance < minfail) chance = minfail;
	if (chance > 50) chance = 50;

	/* Stunning makes spells harder (after minfail) */
	if (player->timed[TMD_STUN] > 50) {
		chance += 25;
	} else if (player->timed[TMD_STUN]) {
		chance += 15;
	}

	/* Amnesia makes spells very difficult */
	if (player->timed[TMD_AMNESIA]) {
		chance = 50 + chance / 2;
	}

	/* Always a 5 percent chance of working */
	if (chance > 95) {
		chance = 95;
	}

	/* Return the chance */
	return (chance);
}